

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.hpp
# Opt level: O0

SignalOptions loguru::SignalOptions::none(void)

{
  SignalOptions SVar1;
  SignalOptions local_10;
  SignalOptions options;
  
  SignalOptions(&local_10);
  SVar1.unsafe_signal_handler = false;
  SVar1.sigabrt = false;
  SVar1.sigbus = false;
  SVar1.sigfpe = false;
  SVar1.sigill = false;
  SVar1.sigint = false;
  SVar1.sigsegv = false;
  SVar1.sigterm = false;
  return SVar1;
}

Assistant:

static SignalOptions none()
		{
			SignalOptions options;
			options.unsafe_signal_handler = false;
			options.sigabrt = false;
			options.sigbus = false;
			options.sigfpe = false;
			options.sigill = false;
			options.sigint = false;
			options.sigsegv = false;
			options.sigterm = false;
			return options;
		}